

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void __thiscall
amrex::ParmParse::addarr
          (ParmParse *this,char *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ptr)

{
  char *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000001b8;
  string *in_stack_000001c0;
  allocator local_59;
  string local_58 [32];
  string *in_stack_ffffffffffffffc8;
  ParmParse *in_stack_ffffffffffffffd0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,in_RSI,&local_59);
  prefixedName(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  (anonymous_namespace)::(anonymous_namespace)::saddarr<std::__cxx11::string>
            (in_stack_000001c0,in_stack_000001b8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return;
}

Assistant:

void
ParmParse::addarr (const char* name,
                const std::vector<std::string>&  ptr)
{
    saddarr(prefixedName(name),ptr);
}